

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.hpp
# Opt level: O2

digest32<160L> * __thiscall
libtorrent::digest32<160L>::operator~(digest32<160L> *__return_storage_ptr__,digest32<160L> *this)

{
  long lVar1;
  
  clear(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 4) {
    *(uint *)((long)(__return_storage_ptr__->m_number)._M_elems + lVar1) =
         ~*(uint *)((long)(this->m_number)._M_elems + lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

digest32 operator~() const noexcept
		{
			digest32 ret;
			for (auto const v : boost::combine(m_number, ret.m_number))
				boost::get<1>(v) = ~boost::get<0>(v);
			return ret;
		}